

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

HSQUIRRELVM sq_open(SQInteger initialstacksize)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  bool bVar4;
  SQSharedState *this;
  SQVM *this_00;
  
  this = (SQSharedState *)sq_vm_malloc(0x180);
  SQSharedState::SQSharedState(this);
  SQSharedState::Init(this);
  this_00 = (SQVM *)sq_vm_malloc(0x158);
  SQVM::SQVM(this_00,this);
  pSVar3 = (this->_root_vm).super_SQObject._unVal.pTable;
  SVar2 = (this->_root_vm).super_SQObject._type;
  (this->_root_vm).super_SQObject._type = OT_THREAD;
  (this->_root_vm).super_SQObject._unVal.pThread = this_00;
  pSVar1 = &(this_00->super_SQCollectable).super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  bVar4 = SQVM::Init(this_00,(SQVM *)0x0,initialstacksize);
  if (!bVar4) {
    (**(this_00->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted)(this_00);
    sq_vm_free(this_00,0x158);
    this_00 = (SQVM *)0x0;
  }
  return this_00;
}

Assistant:

HSQUIRRELVM sq_open(SQInteger initialstacksize)
{
    SQSharedState *ss;
    SQVM *v;
    sq_new(ss, SQSharedState);
    ss->Init();
    v = (SQVM *)SQ_MALLOC(sizeof(SQVM));
    new (v) SQVM(ss);
    ss->_root_vm = v;
    if(v->Init(NULL, initialstacksize)) {
        return v;
    } else {
        sq_delete(v, SQVM);
        return NULL;
    }
    return v;
}